

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::Get_helper(RuntimeCharSet<char16_t> *this,uint k)

{
  CharSetNode *pCVar1;
  int iVar2;
  bool bVar3;
  
  pCVar1 = this->root;
  iVar2 = 0xc;
  while( true ) {
    bVar3 = pCVar1 == (CharSetNode *)&CharSetFull::Instance;
    if (iVar2 + -4 == 0) {
      if (pCVar1 == (CharSetNode *)&CharSetFull::Instance) {
        return true;
      }
      bVar3 = CharBitvec::Get((CharBitvec *)(pCVar1 + 1),k & 0xff);
      return bVar3;
    }
    if (pCVar1 == (CharSetNode *)&CharSetFull::Instance) break;
    pCVar1 = (CharSetNode *)pCVar1[(ulong)(k >> ((byte)iVar2 & 0x1f) & 0xf) + 1]._vptr_CharSetNode;
    iVar2 = iVar2 + -4;
    if (pCVar1 == (CharSetNode *)0x0) {
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool RuntimeCharSet<char16>::Get_helper(uint k) const
    {
        CharSetNode* curr = root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }